

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExceptionDirWrapper.cpp
# Opt level: O0

void * __thiscall
ExceptionEntryWrapper::getFieldPtr(ExceptionEntryWrapper *this,size_t fieldId,size_t subField)

{
  int iVar1;
  undefined4 extraout_var;
  ARM_EXCEPT_RECORD *rec;
  IMAGE_IA64_RUNTIME_FUNCTION_ENTRY *exc;
  void *ptr;
  size_t subField_local;
  size_t fieldId_local;
  ExceptionEntryWrapper *this_local;
  
  iVar1 = (*(this->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[0xc])();
  this_local = (ExceptionEntryWrapper *)CONCAT44(extraout_var,iVar1);
  if (this_local == (ExceptionEntryWrapper *)0x0) {
    this_local = (ExceptionEntryWrapper *)0x0;
  }
  else {
    iVar1 = (*(((this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe)->
              super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xc])();
    if (iVar1 == 1) {
      if (this_local == (ExceptionEntryWrapper *)0x0) {
        this_local = (ExceptionEntryWrapper *)0x0;
      }
      else if (fieldId != 0) {
        if (fieldId == 1) {
          this_local = (ExceptionEntryWrapper *)
                       ((long)&(this_local->super_ExeNodeWrapper).super_ExeElementWrapper.
                               super_AbstractByteBuffer._vptr_AbstractByteBuffer + 4);
        }
        else if (fieldId == 2) {
          this_local = (ExceptionEntryWrapper *)
                       &(this_local->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe;
        }
      }
    }
    else {
      iVar1 = (*(((this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe)->
                super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xc])();
      if ((iVar1 == 2) &&
         (iVar1 = (*(((this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe)->
                    super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xb])(), iVar1 == 0x40)) {
        if (this_local == (ExceptionEntryWrapper *)0x0) {
          this_local = (ExceptionEntryWrapper *)0x0;
        }
        else if ((fieldId != 0) && (fieldId == 1)) {
          this_local = (ExceptionEntryWrapper *)
                       ((long)&(this_local->super_ExeNodeWrapper).super_ExeElementWrapper.
                               super_AbstractByteBuffer._vptr_AbstractByteBuffer + 4);
        }
      }
    }
  }
  return this_local;
}

Assistant:

void* ExceptionEntryWrapper::getFieldPtr(size_t fieldId, size_t subField)
{
    void *ptr = this->getPtr();
    if (!ptr) return nullptr;
    
    if (this->m_Exe->getArch() == Executable::ARCH_INTEL) {
        IMAGE_IA64_RUNTIME_FUNCTION_ENTRY* exc = (IMAGE_IA64_RUNTIME_FUNCTION_ENTRY*) ptr;
        if (!exc) return NULL;

        switch (fieldId) {
            case BEGIN_ADDR : return &exc->BeginAddress;
            case END_ADDR : return &exc->EndAddress;
            case UNWIND_INFO_ADDR : return &exc->UnwindInfoAddress;
        }
    }
    else if (this->m_Exe->getArch() == Executable::ARCH_ARM && this->m_Exe->getBitMode() == 64) {
        ARM_EXCEPT_RECORD *rec = (ARM_EXCEPT_RECORD*) ptr;
        if (!rec) return NULL;
        
        switch (fieldId) {
            case ARM_EXCEPT_START : return &rec->Start;
            case ARM_EXCEPT_XDATA : return &rec->Xdata;
        }
    }
    return ptr;
}